

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O0

void __thiscall aeron::Image::Image(Image *this)

{
  undefined8 *in_RDI;
  array<aeron::concurrent::AtomicBuffer,_3UL> *unaff_retaddr;
  UnsafeBufferPosition *in_stack_ffffffffffffffc8;
  function<void_(const_std::exception_&)> *this_00;
  
  *in_RDI = &PTR__Image_002267c8;
  this_00 = (function<void_(const_std::exception_&)> *)(in_RDI + 1);
  std::array<aeron::concurrent::AtomicBuffer,_3UL>::array(unaff_retaddr);
  concurrent::logbuffer::Header::Header
            ((Header *)(in_RDI + 10),(int32_t)((ulong)in_RDI >> 0x20),(index_t)in_RDI,this_00);
  concurrent::status::Position<aeron::concurrent::status::UnsafeBufferPosition>::Position
            ((Position<aeron::concurrent::status::UnsafeBufferPosition> *)this_00,
             in_stack_ffffffffffffffc8);
  std::shared_ptr<aeron::LogBuffers>::shared_ptr((shared_ptr<aeron::LogBuffers> *)0x1de693);
  std::__cxx11::string::string((string *)(in_RDI + 0x16));
  std::function<void_(const_std::exception_&)>::function(this_00);
  return;
}

Assistant:

Image() :
        m_header(0, 0, this),
        m_subscriberPosition(NULL_POSITION)
    {
    }